

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall Player::killShip(Player *this,int shipId)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined2 *puVar6;
  Ship *this_00;
  
  this_00 = (Ship *)(&this->field_0x264 + (long)shipId * 0x20);
  iVar2 = Ship::getShipHeadi(this_00);
  iVar3 = Ship::getShipHeadj(this_00);
  iVar4 = Ship::getShipLength(this_00);
  bVar1 = Ship::getRotation(this_00);
  if (bVar1) {
    for (lVar5 = (long)iVar3; lVar5 < iVar4 + iVar3; lVar5 = lVar5 + 1) {
      this->playerArea[iVar2][lVar5] = 200;
    }
  }
  else {
    lVar5 = (long)iVar3;
    puVar6 = (undefined2 *)((long)this->playerArea + lVar5 * 0x1a);
    for (; lVar5 < iVar4 + iVar3; lVar5 = lVar5 + 1) {
      *puVar6 = 200;
      puVar6 = puVar6 + 0xc;
    }
  }
  return;
}

Assistant:

void Player::killShip(int shipId)
{
    int headX,headY,length;
    headX = playerFleet[shipId].getShipHeadi();
    headY = playerFleet[shipId].getShipHeadj();
    length = playerFleet[shipId].getShipLength();

    if(playerFleet[shipId].getRotation())
    {
        for(int j = headY; j <= headY+length-1; j++)
        {
            playerArea[headX][j] = Player::KILLED_CODE;

        }

    }
    else
    {
        for(int i = headY; i <= headY + length - 1; i++)
            playerArea[i][headY] = Player::KILLED_CODE;
    }


}